

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev1.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  Biquad *__end0_1;
  Biquad *__end0;
  DirectFormII *pDVar9;
  long lVar10;
  uint uVar11;
  PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *this;
  double *pdVar12;
  PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *this_00;
  DirectFormII *unaff_R14;
  Biquad *__end0_2;
  HighPass<3,_Iir::DirectFormII> f;
  BandStop<4,_Iir::DirectFormI> bs;
  LowPass<8,_Iir::DirectFormII> lp_cheby1;
  Storage SStack_8a8;
  PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *pPStack_898;
  DirectFormII *pDStack_888;
  double dStack_878;
  undefined1 local_870 [456];
  double adStack_6a8 [3];
  undefined1 local_690 [776];
  double adStack_388 [3];
  PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> local_370;
  
  this = (PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *)local_870;
  Iir::PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3>::PoleFilter
            ((PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3> *)this);
  this_00 = this;
  Iir::ChebyshevI::HighPassBase::setup((HighPassBase *)this,3,0.005,1.0);
  iVar8 = 0;
  do {
    uVar11 = 0x3ff00000;
    if (iVar8 != 10) {
      uVar11 = 0;
    }
    dVar4 = (double)((ulong)uVar11 << 0x20);
    lVar10 = 0x88;
    pdVar12 = (double *)(local_870 + 0xc0);
    do {
      dVar2 = *pdVar12;
      dVar3 = pdVar12[1];
      dVar7 = (dVar4 - *(double *)(local_870 + lVar10 + -0x20) * dVar2) -
              *(double *)((long)&pDStack_888 + lVar10) * dVar3;
      dVar4 = *(double *)(local_870 + lVar10 + -0x10);
      dVar5 = *(double *)(local_870 + lVar10);
      dVar6 = *(double *)((long)&dStack_878 + lVar10);
      pdVar12[1] = dVar2;
      *pdVar12 = dVar7;
      dVar4 = dVar3 * dVar6 + dVar5 * dVar7 + dVar4 * dVar2;
      lVar10 = lVar10 + 0x30;
      pdVar12 = pdVar12 + 2;
    } while (lVar10 != 0xe8);
    if (NAN((float)dVar4)) {
      main_cold_5();
      goto LAB_001017ba;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 100000);
  if (ABS((float)dVar4) < 1e-15) {
    this = (PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *)local_690;
    Iir::PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>::PoleFilter
              ((PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8> *)this);
    this_00 = this;
    Iir::ChebyshevI::BandStopBase::setup((BandStopBase *)this,4,0.05,0.005,1.0);
    local_690._400_8_ = 0;
    local_690._408_8_ = 0;
    local_690._384_8_ = 0;
    local_690._392_8_ = 0;
    local_690._368_8_ = 0;
    local_690._376_8_ = 0;
    local_690._352_8_ = 0;
    local_690._360_8_ = 0;
    local_690._336_8_ = 0.0;
    local_690._344_8_ = 0.0;
    local_690._320_8_ = 0.0;
    local_690._328_8_ = 0.0;
    local_690._304_8_ = 0.0;
    local_690._312_8_ = 0.0;
    local_690._288_8_ = 0.0;
    local_690._296_8_ = 0.0;
    iVar8 = 0;
    do {
      uVar11 = 0x3ff00000;
      if (iVar8 != 10) {
        uVar11 = 0;
      }
      lVar10 = 0x88;
      pdVar12 = (double *)(local_690 + 0x120);
      dVar4 = (double)((ulong)uVar11 << 0x20);
      do {
        dVar2 = ((*(double *)((long)adStack_6a8 + lVar10 + 0x10) * *pdVar12 +
                 *(double *)(local_690 + lVar10) * dVar4 +
                 *(double *)((long)adStack_6a8 + lVar10 + 8) * pdVar12[2]) -
                pdVar12[3] * *(double *)(local_870 + lVar10 + 0x1c0)) -
                *(double *)((long)adStack_6a8 + lVar10) * pdVar12[1];
        *pdVar12 = pdVar12[2];
        pdVar12[1] = pdVar12[3];
        pdVar12[2] = dVar4;
        pdVar12[3] = dVar2;
        lVar10 = lVar10 + 0x30;
        pdVar12 = pdVar12 + 4;
        dVar4 = dVar2;
      } while (lVar10 != 0x148);
      if (NAN((float)dVar2)) goto LAB_001017ba;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 100000);
    if (1e-15 <= ABS((float)dVar2)) goto LAB_001017c9;
    this_00 = &local_370;
    Iir::PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter(this_00);
    Iir::ChebyshevI::LowPassBase::setup(&this_00->super_LowPassBase,8,0.01,1.0);
    this = (PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *)0x0;
    unaff_R14 = local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states;
    while( true ) {
      uVar11 = (uint)this;
      dVar4 = sin((double)(int)uVar11 * 0.6094689747964199);
      lVar10 = 0x88;
      pDVar9 = unaff_R14;
      do {
        dVar2 = pDVar9->m_v1;
        dVar3 = pDVar9->m_v2;
        dVar7 = (dVar4 - *(double *)(local_690 + lVar10 + 0x300) * dVar2) -
                *(double *)((long)adStack_388 + lVar10) * dVar3;
        dVar4 = *(double *)((long)adStack_388 + lVar10 + 8);
        dVar5 = *(double *)
                 ((long)(local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_stages + -2) + lVar10
                 );
        dVar6 = *(double *)((long)adStack_388 + lVar10 + 0x10);
        pDVar9->m_v2 = dVar2;
        pDVar9->m_v1 = dVar7;
        dVar4 = dVar3 * dVar6 + dVar5 * dVar7 + dVar4 * dVar2;
        lVar10 = lVar10 + 0x30;
        pDVar9 = pDVar9 + 1;
      } while (lVar10 != 0x148);
      if ((5000 < uVar11) && (1e-05 <= ABS(dVar4))) break;
      this = (PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8> *)
             (ulong)(uVar11 + 1);
      if (uVar11 + 1 == 10000) {
        return 0;
      }
    }
    goto LAB_001017bf;
  }
LAB_001017c4:
  main_cold_4();
LAB_001017c9:
  main_cold_2();
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
  m_numPoles = 0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
  m_maxPoles = 0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.m_pair
       = (PoleZeroPair *)0x0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.super_Cascade.
  m_numStages = 0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.super_Cascade.
  m_maxStages = 0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.super_Cascade.
  m_stageArray = (Biquad *)0x0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
  m_normalW = 0.0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
  m_normalGain = 1.0;
  pPStack_898 = this;
  pDStack_888 = unaff_R14;
  Iir::ChebyshevI::AnalogLowPass::AnalogLowPass
            (&(((HighPassBase *)&this_00->super_LowPassBase)->
              super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).m_analogProto);
  lVar10 = 0x60;
  do {
    *(undefined8 *)
     ((long)(((CascadeStages<4,_Iir::DirectFormI> *)
             &this_00->super_CascadeStages<4,_Iir::DirectFormII>)->m_stages + -2) + lVar10) =
         0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((CascadeStages<4,_Iir::DirectFormI> *)
                    &this_00->super_CascadeStages<4,_Iir::DirectFormII>)->m_stages + lVar10 + -0x58)
    ;
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)((CascadeStages<4,_Iir::DirectFormI> *)
                    &this_00->super_CascadeStages<4,_Iir::DirectFormII>)->m_stages + lVar10 + -0x48)
    ;
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((CascadeStages<4,_Iir::DirectFormI> *)
            &this_00->super_CascadeStages<4,_Iir::DirectFormII>)->m_stages + lVar10 + -0x38) =
         0x3ff0000000000000;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0xc0);
  memset((DirectFormII *)
         (((CascadeStages<4,_Iir::DirectFormI> *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>
          )->m_stages + 2),0,0x120);
  SStack_8a8.maxStages = 2;
  SStack_8a8.stageArray = (Biquad *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>;
  Iir::Cascade::setCascadeStorage((Cascade *)this_00,&SStack_8a8);
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).m_analogProto.super_LayoutBase.m_numPoles =
       0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).m_analogProto.super_LayoutBase.m_maxPoles =
       3;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).m_analogProto.super_LayoutBase.m_pair =
       (PoleZeroPair *)
       ((DirectFormII *)
        (((CascadeStages<4,_Iir::DirectFormI> *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>)
         ->m_stages + 2) + 2);
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
  m_numPoles = 0;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
  m_maxPoles = 3;
  (((HighPassBase *)&this_00->super_LowPassBase)->
  super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.m_pair
       = (this_00->m_analogStorage).m_pairs;
  *(undefined4 *)
   &(((HighPassBase *)&this_00->super_LowPassBase)->
    super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
    m_normalW = 0;
  *(undefined4 *)
   ((long)&(((HighPassBase *)&this_00->super_LowPassBase)->
           super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.
           m_digitalProto.m_normalW + 4) = 0;
  *(undefined4 *)
   &(((HighPassBase *)&this_00->super_LowPassBase)->
    super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.m_digitalProto.
    m_normalGain = 0;
  *(undefined4 *)
   ((long)&(((HighPassBase *)&this_00->super_LowPassBase)->
           super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>).super_PoleFilterBase2.
           m_digitalProto.m_normalGain + 4) = 0x3ff00000;
  ((DirectFormII *)
  (((CascadeStages<4,_Iir::DirectFormI> *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>)->
   m_stages + 2))->m_v1 = 0.0;
  ((DirectFormII *)
  (((CascadeStages<4,_Iir::DirectFormI> *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>)->
   m_stages + 2))->m_v2 = 0.0;
  ((DirectFormII *)
  (((CascadeStages<4,_Iir::DirectFormI> *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>)->
   m_stages + 2))[1].m_v1 = 0.0;
  ((DirectFormII *)
  (((CascadeStages<4,_Iir::DirectFormI> *)&this_00->super_CascadeStages<4,_Iir::DirectFormII>)->
   m_stages + 2))[1].m_v2 = 0.0;
  return 0;
LAB_001017ba:
  main_cold_3();
LAB_001017bf:
  main_cold_1();
  goto LAB_001017c4;
}

Assistant:

int main(int, char**)
{
	const int order = 3;
	Iir::ChebyshevI::HighPass<order> f;
	const float samplingrate = 1000; // Hz
	const float cutoff_frequency = 5; // Hz
	f.setup(samplingrate, cutoff_frequency, 1);
	double b;
	for (int i = 0; i < 100000; i++)
	{
		float a = 0;
		if (i == 10) a = 1;
		b = f.filter(a);
		assert_print(!isnan(b), "Highpass output is NAN\n");
	}
	//fprintf(stderr,"%e\n",b);
	assert_print(fabs(b) < 1E-15, "Highpass value for t->inf to high!");

	Iir::ChebyshevI::BandStop<4, Iir::DirectFormI> bs;
	const float center_frequency = 50;
	const float frequency_width = 5;
	bs.setup(samplingrate, center_frequency, frequency_width, 1);
	bs.reset();
	for (int i = 0; i < 100000; i++)
	{
		float a = 0;
		if (i == 10) a = 1;
		b = bs.filter(a);
		assert_print(!isnan(b), "Bandstop output is NAN\n");
		//fprintf(stderr,"%e\n",b);
	}
	//fprintf(stderr,"%e\n",b);
	assert_print(fabs(b) < 1E-15, "Bandstop value for t->inf to high!");

	Iir::ChebyshevI::LowPass<8> lp_cheby1;
	const float pass_ripple_db2 = 1; // dB
	double norm_cutoff_frequency = 0.01;
	lp_cheby1.setupN(norm_cutoff_frequency,
		pass_ripple_db2);
	double norm_signal_frequency = 0.097;
	for (int i = 0; i < 10000; i++)
	{
		b = fabs(lp_cheby1.filter(sin(2 * M_PI*norm_signal_frequency*i)));
		if (i > 5000) {
			assert_print(b < 1E-5, "Lowpass not removing a sine.\n");
		}
	}

	return 0;


}